

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O3

either * toml::detail::syntax::integer(either *__return_storage_ptr__,spec *s)

{
  sequence local_90;
  sequence local_70;
  sequence local_50;
  sequence local_30;
  
  hex_int(&local_30,s);
  oct_int(&local_50,s);
  bin_int(&local_70,s);
  dec_int(&local_90,s);
  either::
  either<toml::detail::sequence,toml::detail::sequence,toml::detail::sequence,toml::detail::sequence>
            (__return_storage_ptr__,&local_30,&local_50,&local_70,&local_90);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_90.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_70.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_50.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_30.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE either integer(const spec& s)
{
    return either(
            hex_int(s),
            oct_int(s),
            bin_int(s),
            dec_int(s)
        );
}